

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::ConcurrentImageAtomicCase::ConcurrentImageAtomicCase
          (ConcurrentImageAtomicCase *this,Context *context,char *name,char *description,
          int numCalls,int workSize)

{
  int workSize_local;
  int numCalls_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  ConcurrentImageAtomicCase *this_local;
  
  gles31::TestCase::TestCase(&this->super_TestCase,context,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ConcurrentImageAtomicCase_032c4198;
  this->m_numCalls = numCalls;
  this->m_workSize = workSize;
  this->m_program = (ShaderProgram *)0x0;
  this->m_imageReadProgram = (ShaderProgram *)0x0;
  this->m_imageClearProgram = (ShaderProgram *)0x0;
  this->m_imageID = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->m_intermediateResultBuffers);
  return;
}

Assistant:

ConcurrentImageAtomicCase::ConcurrentImageAtomicCase (Context& context, const char* name, const char* description, int numCalls, int workSize)
	: TestCase				(context, name, description)
	, m_numCalls			(numCalls)
	, m_workSize			(workSize)
	, m_program				(DE_NULL)
	, m_imageReadProgram	(DE_NULL)
	, m_imageClearProgram	(DE_NULL)
	, m_imageID				(DE_NULL)
{
}